

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostic.h
# Opt level: O0

void __thiscall psy::Diagnostic::~Diagnostic(Diagnostic *this)

{
  Diagnostic *this_local;
  
  std::__cxx11::string::~string((string *)&this->snippet_);
  Location::~Location(&this->location_);
  DiagnosticDescriptor::~DiagnosticDescriptor(&this->descriptor_);
  return;
}

Assistant:

class PSY_API Diagnostic
{
public:
    Diagnostic(DiagnosticDescriptor descriptor,
               Location location,
               std::string snippet = "");

    /**
     * The DiagnosticDescriptor of \c this Diagnostic.
     */
    const DiagnosticDescriptor& descriptor() const { return descriptor_; }

    /**
     * The actual severity (according to compilation options) of \c this Diagnostic.
     */
    DiagnosticSeverity severity() const;

    /**
     * The Location of \c this Location.
     */
    const Location& location() const { return location_; }

    /**
     * The code snippet associated to \c this Diagnostic.
     */
    const std::string& snippet() const { return snippet_; }

private:
    DiagnosticDescriptor descriptor_;
    Location location_;
    std::string snippet_;
    std::string::size_type outputIndent_;

    friend std::ostream& operator<<(std::ostream& os, const Diagnostic& diagnostic);
    friend class C::InternalsTestSuite;
}